

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O0

void __thiscall el::Configuration::~Configuration(Configuration *this)

{
  Configuration *this_local;
  
  (this->super_Loggable)._vptr_Loggable = (_func_int **)&PTR__Configuration_001930f0;
  std::__cxx11::string::~string((string *)&this->m_value);
  Loggable::~Loggable(&this->super_Loggable);
  return;
}

Assistant:

virtual ~Configuration(void) {
  }